

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Container.cpp
# Opt level: O0

void __thiscall gui::Container::setEnabled(Container *this,bool enabled)

{
  bool bVar1;
  byte in_SIL;
  vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_> *in_RDI;
  shared_ptr<gui::Widget> *c;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_> *__range2;
  Widget *in_stack_ffffffffffffffd0;
  __normal_iterator<std::shared_ptr<gui::Widget>_*,_std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>_>
  local_20;
  pointer *local_18;
  byte local_9;
  
  local_9 = in_SIL & 1;
  if (local_9 == 0) {
    local_18 = &(in_RDI->
                super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    local_20._M_current =
         (shared_ptr<gui::Widget> *)
         std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>::
         begin(in_RDI);
    std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>::end
              (in_RDI);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::shared_ptr<gui::Widget>_*,_std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>_>
                               *)in_stack_ffffffffffffffd0,
                              (__normal_iterator<std::shared_ptr<gui::Widget>_*,_std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>_>
                               *)in_RDI), bVar1) {
      in_stack_ffffffffffffffd0 =
           (Widget *)
           __gnu_cxx::
           __normal_iterator<std::shared_ptr<gui::Widget>_*,_std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>_>
           ::operator*(&local_20);
      std::__shared_ptr_access<gui::Widget,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<gui::Widget,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x29110b);
      Widget::setFocused((Widget *)__range2,__begin2._M_current._7_1_);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<gui::Widget>_*,_std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>_>
      ::operator++(&local_20);
    }
  }
  Widget::setEnabled(in_stack_ffffffffffffffd0,SUB81((ulong)in_RDI >> 0x38,0));
  return;
}

Assistant:

void Container::setEnabled(bool enabled) {
    if (!enabled) {
        for (const auto& c : children_) {
            c->setFocused(false);
        }
    }
    Widget::setEnabled(enabled);
}